

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O0

ssize_t __thiscall DistanceGraph::read(DistanceGraph *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  ifstream *piVar2;
  uint64_t s;
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  *in_stack_ffffffffffffffe8;
  ifstream *ifs;
  
  piVar2 = (ifstream *)CONCAT44(in_register_00000034,__fd);
  std::istream::read((char *)piVar2,(long)&stack0xffffffffffffffe8);
  std::__cxx11::string::resize((ulong)&this->name);
  ifs = piVar2;
  lVar1 = std::__cxx11::string::data();
  std::__cxx11::string::size();
  std::istream::read((char *)piVar2,lVar1);
  sdglib::read_flat_vectorvector<Link>(ifs,in_stack_ffffffffffffffe8);
  return extraout_RAX;
}

Assistant:

void DistanceGraph::read(std::ifstream &input_file) {
    uint64_t s;
    input_file.read((char *) &s, sizeof(s));
    name.resize(s);
    input_file.read((char *) name.data(), name.size());
    sdglib::read_flat_vectorvector(input_file, links);
}